

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O1

Num3072 * __thiscall Num3072::GetInverse(Num3072 *__return_storage_ptr__,Num3072 *this)

{
  Num3072 *this_00;
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined *puStack_1240;
  Num3072 p [12];
  
  p[1].limbs[0x11] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 8;
  do {
    *(undefined8 *)((long)p[0].limbs + lVar6 + -8) = 1;
    puStack_1240 = (undefined *)0x77c40b;
    memset((void *)((long)p[0].limbs + lVar6),0,0x178);
    lVar6 = lVar6 + 0x180;
  } while (lVar6 != 0x1208);
  __return_storage_ptr__->limbs[0] = 1;
  puStack_1240 = (undefined *)0x77c435;
  memset(__return_storage_ptr__->limbs + 1,0,0x178);
  puStack_1240 = (undefined *)0x77c445;
  memcpy(p,this,0x180);
  lVar6 = 0;
  do {
    lVar5 = lVar6 + 1;
    this_00 = p + lVar6 + 1;
    puStack_1240 = (undefined *)0x77c476;
    memcpy(this_00,p + lVar6,0x180);
    uVar3 = 1;
    do {
      puStack_1240 = (undefined *)0x77c483;
      Square(this_00);
      uVar2 = uVar3 >> ((byte)lVar6 & 0x1f);
      uVar3 = uVar3 + 1;
    } while (uVar2 == 0);
    puStack_1240 = (undefined *)0x77c49b;
    Multiply(this_00,p + lVar6);
    lVar6 = lVar5;
  } while (lVar5 != 0xb);
  puStack_1240 = (undefined *)0x77c4b6;
  memcpy(__return_storage_ptr__,p + 0xb,0x180);
  iVar4 = 0x200;
  do {
    puStack_1240 = (undefined *)0x77c4c3;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c4d7;
  Multiply(__return_storage_ptr__,p + 9);
  iVar4 = 0x100;
  do {
    puStack_1240 = (undefined *)0x77c4e4;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c4f8;
  Multiply(__return_storage_ptr__,p + 8);
  iVar4 = 0x80;
  do {
    puStack_1240 = (undefined *)0x77c505;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c519;
  Multiply(__return_storage_ptr__,p + 7);
  iVar4 = 0x40;
  do {
    puStack_1240 = (undefined *)0x77c526;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c53a;
  Multiply(__return_storage_ptr__,p + 6);
  iVar4 = 0x20;
  do {
    puStack_1240 = (undefined *)0x77c547;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c55b;
  Multiply(__return_storage_ptr__,p + 5);
  iVar4 = 8;
  do {
    puStack_1240 = (undefined *)0x77c568;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c57c;
  Multiply(__return_storage_ptr__,p + 3);
  iVar4 = 2;
  do {
    puStack_1240 = (undefined *)0x77c589;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c5a0;
  Multiply(__return_storage_ptr__,p + 1);
  puStack_1240 = (undefined *)0x77c5a8;
  Square(__return_storage_ptr__);
  puStack_1240 = (undefined *)0x77c5b3;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 5;
  do {
    puStack_1240 = (undefined *)0x77c5c0;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c5d4;
  Multiply(__return_storage_ptr__,p + 2);
  iVar4 = 3;
  do {
    puStack_1240 = (undefined *)0x77c5e1;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c5f0;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 2;
  do {
    puStack_1240 = (undefined *)0x77c5fd;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c60c;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 4;
  do {
    puStack_1240 = (undefined *)0x77c619;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c628;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 4;
  do {
    puStack_1240 = (undefined *)0x77c635;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c644;
  Multiply(__return_storage_ptr__,p + 1);
  iVar4 = 3;
  do {
    puStack_1240 = (undefined *)0x77c651;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puStack_1240 = (undefined *)0x77c660;
  Multiply(__return_storage_ptr__,p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  puStack_1240 = &UNK_0077c68d;
  __stack_chk_fail();
}

Assistant:

Num3072 Num3072::GetInverse() const
{
    // For fast exponentiation a sliding window exponentiation with repunit
    // precomputation is utilized. See "Fast Point Decompression for Standard
    // Elliptic Curves" (Brumley, Järvinen, 2008).

    Num3072 p[12]; // p[i] = a^(2^(2^i)-1)
    Num3072 out;

    p[0] = *this;

    for (int i = 0; i < 11; ++i) {
        p[i + 1] = p[i];
        for (int j = 0; j < (1 << i); ++j) p[i + 1].Square();
        p[i + 1].Multiply(p[i]);
    }

    out = p[11];

    square_n_mul(out, 512, p[9]);
    square_n_mul(out, 256, p[8]);
    square_n_mul(out, 128, p[7]);
    square_n_mul(out, 64, p[6]);
    square_n_mul(out, 32, p[5]);
    square_n_mul(out, 8, p[3]);
    square_n_mul(out, 2, p[1]);
    square_n_mul(out, 1, p[0]);
    square_n_mul(out, 5, p[2]);
    square_n_mul(out, 3, p[0]);
    square_n_mul(out, 2, p[0]);
    square_n_mul(out, 4, p[0]);
    square_n_mul(out, 4, p[1]);
    square_n_mul(out, 3, p[0]);

    return out;
}